

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_left(ASMState *as,Reg dest,IRRef lref)

{
  byte bVar1;
  uint ref;
  ASMState *as_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  Reg left;
  IRIns *ir;
  IRIns *in_stack_ffffffffffffffd8;
  RegSet in_stack_ffffffffffffffe0;
  Reg r;
  
  as_00 = (ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)in_EDX * 8);
  bVar1 = *(byte *)((long)as_00->cost + 6);
  ref = (uint)bVar1;
  if ((bVar1 & 0x80) != 0) {
    if (in_EDX < 0x8000) {
      r = (Reg)((ulong)as_00 >> 0x20);
      if (*(char *)((long)as_00->cost + 5) == '\x1c') {
        if ((*(long *)(as_00->cost + 2) == 0) || ((*(uint *)(in_RDI + 0xa8) & 0xffff0000) == 0)) {
          emit_loadk64((ASMState *)CONCAT44(in_ESI,in_EDX),r,
                       (IRIns *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          return;
        }
      }
      else {
        if (*(char *)((long)as_00->cost + 5) == '\x1d') {
          emit_loadk64((ASMState *)CONCAT44(in_ESI,in_EDX),r,
                       (IRIns *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          return;
        }
        if (*(char *)((long)as_00->cost + 5) != '\x16') {
          emit_loadi((ASMState *)CONCAT44(in_ESI,in_EDX),r,(int32_t)as_00);
          return;
        }
      }
    }
    if ((0xfc < ref) && (*(uint *)(in_RDI + 0x100) <= in_EDX)) {
      *(byte *)((long)as_00->cost + 6) = (byte)in_ESI | 0x80;
    }
    ref = ra_allocref(as_00,ref,in_stack_ffffffffffffffe0);
  }
  *(uint *)(in_RDI + 0xb0) = (1 << ((byte)ref & 0x1f) ^ 0xffffffffU) & *(uint *)(in_RDI + 0xb0);
  if (in_ESI != ref) {
    if (((as_00->cost[1] & 0x40) == 0) ||
       (*(ushort *)(in_RDI + 0x158 + (ulong)in_ESI * 2) != in_EDX)) {
      emit_movrr((ASMState *)CONCAT44(ref,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,0,
                 0x197737);
    }
    else {
      *(uint *)(in_RDI + 0xac) = 1 << ((byte)ref & 0x1f) | *(uint *)(in_RDI + 0xac);
      ra_rename((ASMState *)CONCAT44(in_ESI,in_EDX),(Reg)((ulong)as_00 >> 0x20),(Reg)as_00);
    }
  }
  return;
}

Assistant:

static void ra_left(ASMState *as, Reg dest, IRRef lref)
{
  IRIns *ir = IR(lref);
  Reg left = ir->r;
  if (ra_noreg(left)) {
    if (irref_isk(lref)) {
      if (ir->o == IR_KNUM) {
	/* FP remat needs a load except for +0. Still better than eviction. */
	if (tvispzero(ir_knum(ir)) || !(as->freeset & RSET_FPR)) {
	  emit_loadk64(as, dest, ir);
	  return;
	}
#if LJ_64
      } else if (ir->o == IR_KINT64) {
	emit_loadk64(as, dest, ir);
	return;
#if LJ_GC64
      } else if (ir->o == IR_KGC || ir->o == IR_KPTR || ir->o == IR_KKPTR) {
	emit_loadk64(as, dest, ir);
	return;
#endif
#endif
      } else if (ir->o != IR_KPRI) {
	lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
		   ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
		   "K%03d has bad IR op %d", REF_BIAS - lref, ir->o);
	emit_loadi(as, dest, ir->i);
	return;
      }
    }
    if (!ra_hashint(left) && !iscrossref(as, lref))
      ra_sethint(ir->r, dest);  /* Propagate register hint. */
    left = ra_allocref(as, lref, dest < RID_MAX_GPR ? RSET_GPR : RSET_FPR);
  }
  ra_noweak(as, left);
  /* Move needed for true 3-operand instruction: y=a+b ==> y=a; y+=b. */
  if (dest != left) {
    /* Use register renaming if dest is the PHI reg. */
    if (irt_isphi(ir->t) && as->phireg[dest] == lref) {
      ra_modified(as, left);
      ra_rename(as, left, dest);
    } else {
      emit_movrr(as, ir, dest, left);
    }
  }
}